

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImRect ImGui::GetPopupAllowedExtentRect(ImGuiWindow_conflict *window)

{
  ImVec2 IVar1;
  ImGuiContext_conflict1 *pIVar2;
  ImGuiPlatformMonitor *pIVar3;
  float fVar4;
  float fVar5;
  ImRect IVar6;
  ImRect IVar7;
  
  pIVar2 = GImGui;
  if (window->ViewportAllowPlatformMonitorExtend < 0) {
    IVar6 = ImGuiViewportP::GetMainRect((ImGuiViewportP *)window->Viewport);
  }
  else {
    pIVar3 = ImVector<ImGuiPlatformMonitor>::operator[]
                       (&(GImGui->PlatformIO).Monitors,window->ViewportAllowPlatformMonitorExtend);
    IVar1 = pIVar3->WorkPos;
    IVar6.Max.y = (pIVar3->WorkSize).y + IVar1.y;
    IVar6.Max.x = (pIVar3->WorkSize).x + IVar1.x;
    IVar6.Min = IVar1;
  }
  IVar1 = (pIVar2->Style).DisplaySafeAreaPadding;
  fVar4 = IVar1.x;
  fVar5 = IVar1.y;
  fVar4 = (float)((uint)-fVar4 & -(uint)(fVar4 + fVar4 < IVar6.Max.x - IVar6.Min.x));
  fVar5 = (float)((uint)-fVar5 & -(uint)(fVar5 + fVar5 < IVar6.Max.y - IVar6.Min.y));
  IVar7.Min.x = IVar6.Min.x - fVar4;
  IVar7.Min.y = IVar6.Min.y - fVar5;
  IVar7.Max.y = fVar5 + IVar6.Max.y;
  IVar7.Max.x = fVar4 + IVar6.Max.x;
  return IVar7;
}

Assistant:

ImRect ImGui::GetPopupAllowedExtentRect(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    ImRect r_screen;
    if (window->ViewportAllowPlatformMonitorExtend >= 0)
    {
        // Extent with be in the frame of reference of the given viewport (so Min is likely to be negative here)
        const ImGuiPlatformMonitor& monitor = g.PlatformIO.Monitors[window->ViewportAllowPlatformMonitorExtend];
        r_screen.Min = monitor.WorkPos;
        r_screen.Max = monitor.WorkPos + monitor.WorkSize;
    }
    else
    {
        // Use the full viewport area (not work area) for popups
        r_screen = window->Viewport->GetMainRect();
    }
    ImVec2 padding = g.Style.DisplaySafeAreaPadding;
    r_screen.Expand(ImVec2((r_screen.GetWidth() > padding.x * 2) ? -padding.x : 0.0f, (r_screen.GetHeight() > padding.y * 2) ? -padding.y : 0.0f));
    return r_screen;
}